

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O3

void rtr_prefix_pdu_2_pfx_record(rtr_socket *rtr_socket,void *pdu,pfx_record *pfxr,pdu_type type)

{
  long lVar1;
  undefined8 uVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (type == IPV4_PREFIX) {
    (pfxr->prefix).u.addr4.addr = *(uint32_t *)((long)pdu + 0xc);
    pfxr->asn = *(uint32_t *)((long)pdu + 0x10);
    (pfxr->prefix).ver = LRTR_IPV4;
  }
  else {
    if (type != IPV6_PREFIX) {
      __assert_fail("type == IPV4_PREFIX || type == IPV6_PREFIX",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/rtr/packets.c"
                    ,0x2b7,
                    "void rtr_prefix_pdu_2_pfx_record(const struct rtr_socket *, const void *, struct pfx_record *, const enum pdu_type)"
                   );
    }
    pfxr->asn = *(uint32_t *)((long)pdu + 0x1c);
    (pfxr->prefix).ver = LRTR_IPV6;
    uVar2 = *(undefined8 *)((long)pdu + 0x14);
    *(undefined8 *)&(pfxr->prefix).u = *(undefined8 *)((long)pdu + 0xc);
    *(undefined8 *)((long)&(pfxr->prefix).u + 8) = uVar2;
  }
  pfxr->min_len = *(uint8_t *)((long)pdu + 9);
  pfxr->max_len = *(uint8_t *)((long)pdu + 10);
  pfxr->socket = rtr_socket;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void rtr_prefix_pdu_2_pfx_record(const struct rtr_socket *rtr_socket, const void *pdu, struct pfx_record *pfxr,
					const enum pdu_type type)
{
	assert(type == IPV4_PREFIX || type == IPV6_PREFIX);
	if (type == IPV4_PREFIX) {
		const struct pdu_ipv4 *ipv4 = pdu;

		pfxr->prefix.u.addr4.addr = ipv4->prefix;
		pfxr->asn = ipv4->asn;
		pfxr->prefix.ver = LRTR_IPV4;
		pfxr->min_len = ipv4->prefix_len;
		pfxr->max_len = ipv4->max_prefix_len;
		pfxr->socket = rtr_socket;
	} else if (type == IPV6_PREFIX) {
		const struct pdu_ipv6 *ipv6 = pdu;

		pfxr->asn = ipv6->asn;
		pfxr->prefix.ver = LRTR_IPV6;
		memcpy(pfxr->prefix.u.addr6.addr, ipv6->prefix, sizeof(pfxr->prefix.u.addr6.addr));
		pfxr->min_len = ipv6->prefix_len;
		pfxr->max_len = ipv6->max_prefix_len;
		pfxr->socket = rtr_socket;
	}
}